

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall Json::JsonObject::toList_abi_cxx11_(JsonObject *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  pointer pjVar2;
  undefined4 extraout_var;
  reference __x;
  size_t i;
  ulong __n;
  pointer pjVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  JsonObject *local_58;
  ulong local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  x;
  
  this_00 = &this->__lstJsonText;
  local_58 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_78)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  pjVar3 = (local_58->__mpJsonObject).
           super__Vector_base<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pjVar2 = (local_58->__mpJsonObject).
           super__Vector_base<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (ulong)((long)pjVar2 - (long)pjVar3) >> 5;
  iVar4 = 0;
  for (; pjVar3 != pjVar2; pjVar3 = pjVar3 + 1) {
    (*(((pjVar3->key).super___shared_ptr<Json::JsonString,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_JsonValue)._vptr_JsonValue[1])(&local_78);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    iVar1 = (*((pjVar3->value).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_JsonValue[10])();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&x,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(extraout_var,iVar1));
    for (__n = 0; __n < (ulong)((long)x.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)x.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1
        ) {
      __x = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&x,__n);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,__x);
    }
    iVar4 = iVar4 + 1;
    if (iVar4 < (int)local_50) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&x);
    pjVar2 = (local_58->__mpJsonObject).
             super__Vector_base<Json::JsonObject::json_object_element_t,_std::allocator<Json::JsonObject::json_object_element_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_78)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  return this_00;
}

Assistant:

const std::vector<std::string> &Json::JsonObject::toList() {
    __lstJsonText.clear();
    __lstJsonText.push_back(_JSCS(JSON_OBJECT_BEGIN));
    int __index = 0, __size = __mpJsonObject.size();
    for (auto iter = __mpJsonObject.begin(); iter != __mpJsonObject.end(); ++iter) {
        __lstJsonText.push_back(iter->key->toString());
        __lstJsonText.push_back(_JSCS(JSON_OBJ_SEPARATE));
        auto x = iter->value->toList();
        for (size_t i = 0; i < x.size(); ++i) __lstJsonText.push_back(x.at(i));
        __index++;
        if (__index < __size) __lstJsonText.push_back(_JSCS(JSON_SEPARATE));
    }
    __lstJsonText.push_back(_JSCS(JSON_OBJECT_END));
    return __lstJsonText;
}